

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void __thiscall google::protobuf::Field::Field(Field *this,Field *from)

{
  InternalMetadata *this_00;
  void *pvVar1;
  string *psVar2;
  int iVar3;
  int32 iVar4;
  int32 iVar5;
  Arena *pAVar6;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__Field_003e3768;
  RepeatedPtrField<google::protobuf::Option>::RepeatedPtrField(&this->options_,&from->options_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  pvVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->name_).ptr_;
  if (psVar2->_M_string_length != 0) {
    pAVar6 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,psVar2,pAVar6
              );
  }
  (this->type_url_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->type_url_).ptr_;
  if (psVar2->_M_string_length != 0) {
    pAVar6 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&this->type_url_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,psVar2,
               pAVar6);
  }
  (this->json_name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->json_name_).ptr_;
  if (psVar2->_M_string_length != 0) {
    pAVar6 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&this->json_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,psVar2,
               pAVar6);
  }
  (this->default_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->default_value_).ptr_;
  if (psVar2->_M_string_length != 0) {
    pAVar6 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&this->default_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               psVar2,pAVar6);
  }
  this->packed_ = from->packed_;
  iVar3 = from->cardinality_;
  iVar4 = from->number_;
  iVar5 = from->oneof_index_;
  this->kind_ = from->kind_;
  this->cardinality_ = iVar3;
  this->number_ = iVar4;
  this->oneof_index_ = iVar5;
  return;
}

Assistant:

Field::Field(const Field& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      options_(from.options_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (!from._internal_name().empty()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArena());
  }
  type_url_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (!from._internal_type_url().empty()) {
    type_url_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_type_url(),
      GetArena());
  }
  json_name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (!from._internal_json_name().empty()) {
    json_name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_json_name(),
      GetArena());
  }
  default_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (!from._internal_default_value().empty()) {
    default_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_default_value(),
      GetArena());
  }
  ::memcpy(&kind_, &from.kind_,
    static_cast<size_t>(reinterpret_cast<char*>(&packed_) -
    reinterpret_cast<char*>(&kind_)) + sizeof(packed_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.Field)
}